

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

void __thiscall
wabt::Module::AppendField
          (Module *this,
          unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_> *field)

{
  pointer __p;
  _Head_base<0UL,_wabt::ModuleField_*,_false> local_60;
  _Head_base<0UL,_wabt::ModuleField_*,_false> local_58;
  _Head_base<0UL,_wabt::ModuleField_*,_false> local_50;
  _Head_base<0UL,_wabt::ModuleField_*,_false> local_48;
  _Head_base<0UL,_wabt::ModuleField_*,_false> local_40;
  _Head_base<0UL,_wabt::ModuleField_*,_false> local_38;
  _Head_base<0UL,_wabt::ModuleField_*,_false> local_30;
  _Head_base<0UL,_wabt::ModuleField_*,_false> local_28;
  _Head_base<0UL,_wabt::ModuleField_*,_false> local_20;
  _Head_base<0UL,_wabt::ModuleField_*,_false> local_18;
  _Head_base<0UL,_wabt::ModuleField_*,_false> local_10;
  
  local_60._M_head_impl =
       (field->_M_t).
       super___uniq_ptr_impl<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>._M_t.
       super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
       super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl;
  switch((local_60._M_head_impl)->type_) {
  case Func:
    (field->_M_t).super___uniq_ptr_impl<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
    super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl = (ModuleField *)0x0;
    local_10._M_head_impl = local_60._M_head_impl;
    AppendField(this,(unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>
                      *)&local_10);
    if (local_10._M_head_impl != (ModuleField *)0x0) {
      (*(local_10._M_head_impl)->_vptr_ModuleField[1])();
    }
    break;
  case Global:
    (field->_M_t).super___uniq_ptr_impl<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
    super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl = (ModuleField *)0x0;
    local_18._M_head_impl = local_60._M_head_impl;
    AppendField(this,(unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_>
                      *)&local_18);
    if (local_18._M_head_impl != (ModuleField *)0x0) {
      (*(local_18._M_head_impl)->_vptr_ModuleField[1])();
    }
    break;
  case Import:
    (field->_M_t).super___uniq_ptr_impl<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
    super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl = (ModuleField *)0x0;
    local_20._M_head_impl = local_60._M_head_impl;
    AppendField(this,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                      *)&local_20);
    if (local_20._M_head_impl != (ModuleField *)0x0) {
      (*(local_20._M_head_impl)->_vptr_ModuleField[1])();
    }
    break;
  case Export:
    (field->_M_t).super___uniq_ptr_impl<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
    super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl = (ModuleField *)0x0;
    local_28._M_head_impl = local_60._M_head_impl;
    AppendField(this,(unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_>
                      *)&local_28);
    if (local_28._M_head_impl != (ModuleField *)0x0) {
      (*(local_28._M_head_impl)->_vptr_ModuleField[1])();
    }
    break;
  case Type:
    (field->_M_t).super___uniq_ptr_impl<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
    super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl = (ModuleField *)0x0;
    local_30._M_head_impl = local_60._M_head_impl;
    AppendField(this,(unique_ptr<wabt::TypeModuleField,_std::default_delete<wabt::TypeModuleField>_>
                      *)&local_30);
    if (local_30._M_head_impl != (ModuleField *)0x0) {
      (*(local_30._M_head_impl)->_vptr_ModuleField[1])();
    }
    break;
  case Table:
    (field->_M_t).super___uniq_ptr_impl<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
    super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl = (ModuleField *)0x0;
    local_38._M_head_impl = local_60._M_head_impl;
    AppendField(this,(unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                      *)&local_38);
    if (local_38._M_head_impl != (ModuleField *)0x0) {
      (*(local_38._M_head_impl)->_vptr_ModuleField[1])();
    }
    break;
  case ElemSegment:
    (field->_M_t).super___uniq_ptr_impl<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
    super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl = (ModuleField *)0x0;
    local_40._M_head_impl = local_60._M_head_impl;
    AppendField(this,(unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                      *)&local_40);
    if (local_40._M_head_impl != (ModuleField *)0x0) {
      (*(local_40._M_head_impl)->_vptr_ModuleField[1])();
    }
    break;
  case Memory:
    (field->_M_t).super___uniq_ptr_impl<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
    super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl = (ModuleField *)0x0;
    local_48._M_head_impl = local_60._M_head_impl;
    AppendField(this,(unique_ptr<wabt::MemoryModuleField,_std::default_delete<wabt::MemoryModuleField>_>
                      *)&local_48);
    if (local_48._M_head_impl != (ModuleField *)0x0) {
      (*(local_48._M_head_impl)->_vptr_ModuleField[1])();
    }
    break;
  case DataSegment:
    (field->_M_t).super___uniq_ptr_impl<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
    super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl = (ModuleField *)0x0;
    local_50._M_head_impl = local_60._M_head_impl;
    AppendField(this,(unique_ptr<wabt::DataSegmentModuleField,_std::default_delete<wabt::DataSegmentModuleField>_>
                      *)&local_50);
    if (local_50._M_head_impl != (ModuleField *)0x0) {
      (*(local_50._M_head_impl)->_vptr_ModuleField[1])();
    }
    break;
  case Start:
    (field->_M_t).super___uniq_ptr_impl<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
    super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl = (ModuleField *)0x0;
    local_58._M_head_impl = local_60._M_head_impl;
    AppendField(this,(unique_ptr<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_>
                      *)&local_58);
    if (local_58._M_head_impl != (ModuleField *)0x0) {
      (*(local_58._M_head_impl)->_vptr_ModuleField[1])();
    }
    break;
  case Tag:
    (field->_M_t).super___uniq_ptr_impl<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::ModuleField_*,_std::default_delete<wabt::ModuleField>_>.
    super__Head_base<0UL,_wabt::ModuleField_*,_false>._M_head_impl = (ModuleField *)0x0;
    AppendField(this,(unique_ptr<wabt::TagModuleField,_std::default_delete<wabt::TagModuleField>_> *
                     )&local_60);
    if (local_60._M_head_impl != (ModuleField *)0x0) {
      (*(local_60._M_head_impl)->_vptr_ModuleField[1])();
    }
  }
  return;
}

Assistant:

void LocalTypes::Set(const TypeVector& types) {
  decls_.clear();
  if (types.empty()) {
    return;
  }

  Type type = types[0];
  Index count = 1;
  for (Index i = 1; i < types.size(); ++i) {
    if (types[i] != type) {
      decls_.emplace_back(type, count);
      type = types[i];
      count = 1;
    } else {
      ++count;
    }
  }
  decls_.emplace_back(type, count);
}